

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

ssize_t read_block(int fd,void *buf,size_t nbyte)

{
  long lVar1;
  long lVar2;
  
  lVar1 = read(fd,buf,nbyte);
  lVar2 = 0;
  while (0 < lVar1) {
    nbyte = nbyte - lVar1;
    buf = (void *)((long)buf + lVar1);
    lVar2 = lVar2 + lVar1;
    lVar1 = read(fd,buf,nbyte);
  }
  if (lVar1 != 0) {
    lVar2 = lVar1;
  }
  return lVar2;
}

Assistant:

ssize_t read_block(int fd, void *buf, size_t nbyte) {
  ssize_t rd;
  size_t total;
  total = 0;
  while ((rd = read(fd, buf, nbyte)) > 0) {
    nbyte -= rd;
    buf = (char *)buf + rd;
    total += rd;
  }
  if (rd < 0) {
    return rd;
  } else {
    return total;
  }
}